

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

XmlWriter * __thiscall
Catch::XmlWriter::writeComment(XmlWriter *this,string *text,XmlFormatting fmt)

{
  ostream *poVar1;
  
  ensureTagClosed(this);
  if ((fmt & Indent) != None) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this->m_os,(this->m_indent)._M_dataplus._M_p,
               (this->m_indent)._M_string_length);
  }
  poVar1 = (ostream *)this->m_os;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"<!--",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(text->_M_dataplus)._M_p,text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-->",3);
  this->m_needsNewline = (bool)((byte)fmt >> 1 & 1);
  return this;
}

Assistant:

XmlWriter& XmlWriter::writeComment( std::string const& text, XmlFormatting fmt) {
        ensureTagClosed();
        if (shouldIndent(fmt)) {
            m_os << m_indent;
        }
        m_os << "<!--" << text << "-->";
        applyFormatting(fmt);
        return *this;
    }